

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::savedashbuffers(Forth *this)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  char *pcVar5;
  iostate statue;
  streamsize length;
  undefined1 local_270 [4];
  iostate statue_1;
  string buffer;
  pair<const_unsigned_int,_cppforth::Forth::BlockInfo> *block;
  iterator __end3;
  iterator __begin3;
  map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
  *__range3;
  undefined1 local_220 [8];
  fstream f;
  char local_210 [512];
  Forth *local_10;
  Forth *this_local;
  
  local_10 = this;
  _Var3 = std::operator|(_S_out,_S_in);
  _Var3 = std::operator|(_Var3,_S_bin);
  std::fstream::fstream(local_220,(string *)&this->blockFileName,_Var3);
  bVar1 = std::fstream::is_open();
  if ((bVar1 & 1) != 0) {
    __end3 = std::
             map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
             ::begin(&this->blocksInProcess);
    block = (pair<const_unsigned_int,_cppforth::Forth::BlockInfo> *)
            std::
            map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
            ::end(&this->blocksInProcess);
    while (bVar2 = std::operator==(&__end3,(_Self *)&block), ((bVar2 ^ 0xffU) & 1) != 0) {
      buffer.field_2._8_8_ =
           std::_Rb_tree_iterator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>::
           operator*(&__end3);
      if (((((reference)buffer.field_2._8_8_)->second).blockModified & 1U) != 0) {
        std::istream::seekg((long)local_220,
                            ((((reference)buffer.field_2._8_8_)->second).blockNumber - 1) * 0x400);
        iVar4 = std::ios::rdstate();
        if (iVar4 == 0) {
          std::__cxx11::string::string((string *)local_270);
          moveFromDataSpace(this,(string *)local_270,*(Cell *)(buffer.field_2._8_8_ + 8),0x400);
          pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_270);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270)
          ;
          std::ostream::write(local_210,(long)pcVar5);
          std::ios::rdstate();
          std::istream::gcount();
          std::ios::rdstate();
          *(undefined1 *)(buffer.field_2._8_8_ + 0xc) = 0;
          std::__cxx11::string::~string((string *)local_270);
        }
        std::ios::rdstate();
      }
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>::operator++
                (&__end3);
    }
  }
  std::fstream::~fstream(local_220);
  return;
}

Assistant:

void savedashbuffers()
		{
			std::fstream f(blockFileName, std::ios_base::out | std::ios_base::in | std::ios_base::binary);
			if (f.is_open()) {
				for (auto& block : blocksInProcess) {
					if (block.second.blockModified) {
						f.seekg(static_cast<size_t>(block.second.blockNumber-1)*1024L, std::ios_base::beg);
						if (f.rdstate() == 0) {
							std::string buffer{};
							moveFromDataSpace(buffer, block.second.blockLocation, 1024);
							f.write(buffer.c_str(), buffer.size());
							auto statue = f.rdstate();
							auto length = f.gcount();
							statue = f.rdstate();
							block.second.blockModified = false;
						}
						auto statue = f.rdstate();
					}
				}
			}
		}